

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randen_slow.cc
# Opt level: O2

void absl::lts_20250127::random_internal::RandenSlow::Absorb(void *seed_void,void *state_void)

{
  ulong *puVar1;
  long lVar2;
  
  for (lVar2 = 0; lVar2 != 0x1e; lVar2 = lVar2 + 1) {
    puVar1 = (ulong *)((long)state_void + lVar2 * 8 + 0x10);
    *puVar1 = *puVar1 ^ *(ulong *)((long)seed_void + lVar2 * 8);
  }
  return;
}

Assistant:

void RandenSlow::Absorb(const void* seed_void, void* state_void) {
  auto* state =
      reinterpret_cast<uint64_t * ABSL_RANDOM_INTERNAL_RESTRICT>(state_void);
  const auto* seed =
      reinterpret_cast<const uint64_t * ABSL_RANDOM_INTERNAL_RESTRICT>(
          seed_void);

  constexpr size_t kCapacityBlocks =
      RandenTraits::kCapacityBytes / sizeof(uint64_t);
  static_assert(
      kCapacityBlocks * sizeof(uint64_t) == RandenTraits::kCapacityBytes,
      "Not i*V");

  for (size_t i = kCapacityBlocks;
       i < RandenTraits::kStateBytes / sizeof(uint64_t); ++i) {
    state[i] ^= seed[i - kCapacityBlocks];
  }
}